

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool dg::pta::PointerAnalysisFSInv::overwriteMOFromFree(MemoryMapT *mm,PSNode *target)

{
  Offset off;
  size_type sVar1;
  size_t sVar2;
  bool bVar3;
  Pointer PVar4;
  mapped_type *S;
  MemoryObject *mo;
  const_iterator *in_stack_ffffffffffffff68;
  PointerIdPointsToSet *in_stack_ffffffffffffff70;
  PSNode *in_stack_ffffffffffffff78;
  MemoryMapT *in_stack_ffffffffffffff80;
  PSNode *target_00;
  PointsToMapT *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  Offset local_68;
  Offset local_60;
  key_type *in_stack_ffffffffffffffa8;
  map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
  *in_stack_ffffffffffffffb0;
  PSNode *local_40;
  Offset local_30;
  mapped_type *local_28;
  MemoryObject *local_20;
  
  local_20 = getOrCreateMO(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar1 = std::
          map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
          ::size((map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                  *)0x17f2df);
  if (sVar1 == 1) {
    in_stack_ffffffffffffff88 = &local_20->pointsTo;
    Offset::Offset(&local_30,0);
    local_28 = std::
               map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
               ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    sVar2 = PointerIdPointsToSet::size((PointerIdPointsToSet *)0x17f323);
    bVar3 = false;
    if (sVar2 == 1) {
      PointerIdPointsToSet::begin(in_stack_ffffffffffffff70);
      PVar4 = PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff68);
      local_40 = PVar4.target;
      bVar3 = local_40 == INVALIDATED;
    }
    if (bVar3) {
      return false;
    }
    in_stack_ffffffffffffff97 = 0;
  }
  std::
  map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
  ::clear((map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
           *)0x17f38f);
  Offset::Offset(&local_60,0);
  std::
  map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
  ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  target_00 = INVALIDATED;
  Offset::Offset(&local_68,0);
  off.offset._7_1_ = in_stack_ffffffffffffff97;
  off.offset._0_7_ = in_stack_ffffffffffffff90;
  PointerIdPointsToSet::add((PointerIdPointsToSet *)in_stack_ffffffffffffff88,target_00,off);
  return true;
}

Assistant:

static bool overwriteMOFromFree(MemoryMapT *mm, PSNode *target) {
        // if we know exactly which memory object
        // is being used for freeing the memory,
        // we can set it to invalidated
        auto *mo = getOrCreateMO(mm, target);
        if (mo->pointsTo.size() == 1) {
            auto &S = mo->pointsTo[0];
            if (S.size() == 1 && (*S.begin()).target == INVALIDATED) {
                return false; // no update
            }
        }

        mo->pointsTo.clear();
        mo->pointsTo[0].add(INVALIDATED, 0);
        return true;
    }